

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalSetEndOfFile(CPalThread *pThread,HANDLE hFile)

{
  PAL_ERROR PVar1;
  PAL_ERROR PVar2;
  int iVar3;
  ulong __length;
  undefined8 *local_38;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  CFileProcessLocalData *pLocalData;
  
  pLocalDataLock = (IDataLock *)0x0;
  pFileObject = (IPalObject *)0x0;
  local_38 = (undefined8 *)0x0;
  if (hFile == (HANDLE)0xffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_002d6b2c;
    PVar1 = 6;
    __length = 0;
    goto LAB_002d6a87;
  }
  PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                    (g_pObjectManager,pThread,hFile,aotFile,0x40000000,&pLocalDataLock);
  if (PVar1 == 0) {
    __length = 0;
    PVar1 = (*pLocalDataLock->_vptr_IDataLock[3])(pLocalDataLock,pThread,0,&local_38,&pFileObject);
    if (PVar1 == 0) {
      if (*(int *)((long)&pFileObject[2]._vptr_IPalObject + 4) == 1) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002d6b2c;
        PVar1 = 5;
        goto LAB_002d6a35;
      }
      __length = lseek64(*(int *)&pFileObject[1]._vptr_IPalObject,0,1);
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_002d6b2c:
        abort();
      }
      if (-1 < (long)__length) {
        iVar3 = ftruncate64(*(int *)&pFileObject[1]._vptr_IPalObject,__length);
        if (iVar3 == 0) {
          PVar1 = 0;
          goto LAB_002d6a74;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002d6b2c;
      }
      PVar1 = FILEGetLastErrorFromErrno();
    }
  }
  else {
LAB_002d6a35:
    __length = 0;
  }
LAB_002d6a74:
  if (local_38 != (undefined8 *)0x0) {
    (**(code **)*local_38)(local_38,pThread,0);
  }
LAB_002d6a87:
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
  }
  PVar2 = 0x57;
  if (__length < 0xfffffff0001) {
    PVar2 = PVar1;
  }
  if (PVar1 != 0x70) {
    PVar2 = PVar1;
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetEndOfFile(
    CPalThread *pThread,
    HANDLE hFile
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    off_t curr = 0;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalSetEndOfFileExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_WRITE,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetEndOfFileExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetEndOfFileExit;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto InternalSetEndOfFileExit;
    }
    
    curr = lseek(pLocalData->unix_fd, 0, SEEK_CUR);

    TRACE("current file pointer offset is %u\n", curr);
    if ( curr < 0 )
    {
        ERROR("lseek returned %ld\n", curr);
        palError = FILEGetLastErrorFromErrno();
        goto InternalSetEndOfFileExit;
    }

#if SIZEOF_OFF_T > 4
#if !HAVE_FTRUNCATE_LARGE_LENGTH_SUPPORT
    // ftruncate will return the wrong value for some large lengths.
    // We'll short-circuit the process and simply return failure for
    // the set of values that covers those cases, all of which would
    // have failed anyway on any standard-sized hard drive.
    if (curr >= 0xFFFFFFFF000ULL)
    {
        ERROR("Skipping ftruncate because the offset is too large\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalSetEndOfFileExit;
    }
#endif  // !HAVE_FTRUNCATE_LARGE_LENGTH_SUPPORT
#endif  // SIZEOF_OFF_T

#if HAS_FTRUNCATE_LENGTH_ISSUE
    // Perform an additional check to make sure that there's likely to be enough free space to satisfy the
    // request. Do this because it's been observed on Mac OSX that ftruncate can return failure but still
    // extend the file to consume the remainder of free space.
    // 
    struct statfs sFileSystemStats;
    off_t cbFreeSpace;
    if (fstatfs(pLocalData->unix_fd, &sFileSystemStats) != 0)
    {
        ERROR("fstatfs failed\n");
        palError = FILEGetLastErrorFromErrno();
        goto InternalSetEndOfFileExit;
    } 

    // Free space is free blocks times the size of each block in bytes.
    cbFreeSpace = (off_t)sFileSystemStats.f_bavail * (off_t)sFileSystemStats.f_bsize;

    if (curr > cbFreeSpace)
    {
        ERROR("Not enough disk space for ftruncate\n");
        palError = ERROR_DISK_FULL;
        goto InternalSetEndOfFileExit;
    }
#endif // HAS_FTRUNCATE_LENGTH_ISSUE

    if ( ftruncate(pLocalData->unix_fd, curr) != 0 )
    {
        ERROR("ftruncate failed\n");
        if ( errno == EACCES )
        {
            ERROR("file may not be writable\n");
        }
        palError = FILEGetLastErrorFromErrno();
        goto InternalSetEndOfFileExit;
    }


InternalSetEndOfFileExit:

    // Windows starts returning ERROR_INVALID_PARAMETER at an arbitrary file size (~16TB). The file system
    // underneath us may be able to support larger and it would be a shame to prevent that. As a compromise,
    // if the operation fails and the file size was above the Windows limit map ERROR_DISK_FULL to
    // ERROR_INVALID_PARAMETER.
    // curr has been checked to be positive after getting the value from lseek. The following cast is put to
    // suppress the compilation warning.
    if (palError == ERROR_DISK_FULL && (static_cast<UINT64>(curr) > 0x00000fffffff0000ULL ) )
        palError = ERROR_INVALID_PARAMETER;

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}